

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

void bloaty::wasm::AddWebAssemblyFallback(RangeSink *sink)

{
  string_view data;
  string_view file_range;
  InputFile *pIVar1;
  RangeSink *in_RDI;
  string_view sVar2;
  string_view sVar3;
  char *unaff_retaddr;
  size_t in_stack_00000008;
  anon_class_8_1_89918b91 *in_stack_00000010;
  string_view in_stack_00000018;
  undefined8 local_50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  
  pIVar1 = RangeSink::input_file(in_RDI);
  sVar2 = InputFile::data(pIVar1);
  ForEachSection<bloaty::wasm::AddWebAssemblyFallback(bloaty::RangeSink*)::__0>
            (in_stack_00000018,in_stack_00000010);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,local_50);
  pIVar1 = RangeSink::input_file(in_RDI);
  sVar3 = InputFile::data(pIVar1);
  data._M_str = in_stack_ffffffffffffffd0;
  data._M_len = in_stack_ffffffffffffffc8;
  StrictSubstr(data,(size_t)in_stack_ffffffffffffffc0,(size_t)sVar3._M_str);
  sVar3._M_str = (char *)in_stack_00000010;
  sVar3._M_len = in_stack_00000008;
  file_range._M_str = unaff_retaddr;
  file_range._M_len = (size_t)in_RDI;
  RangeSink::AddFileRange((RangeSink *)sVar2._M_str,(char *)sVar2._M_len,sVar3,file_range);
  return;
}

Assistant:

void AddWebAssemblyFallback(RangeSink* sink) {
  ForEachSection(sink->input_file().data(), [sink](const Section& section) {
    std::string name2 =
        std::string("[section ") + std::string(section.name) + std::string("]");
    sink->AddFileRange("wasm_overhead", name2, section.data);
  });
  sink->AddFileRange("wasm_overhead", "[WASM Header]",
                     StrictSubstr(sink->input_file().data(), 0, 8));
}